

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ucase.cpp
# Opt level: O2

UBool ucase_addStringCaseClosure_63(UChar *s,int32_t length,USetAdder *sa)

{
  ushort uVar1;
  ulong uVar2;
  int iVar3;
  int iVar4;
  long lVar5;
  ulong uVar6;
  int iVar7;
  int iVar8;
  uint c;
  long lVar9;
  
  if (0xfffffffd < length - 4U && s != (UChar *)0x0) {
    uVar6 = 0x49;
    iVar3 = 0;
    while (iVar4 = iVar3, uVar2 = (long)(iVar4 + (int)uVar6) / 2, iVar4 < (int)uVar6) {
      iVar3 = (int)uVar2;
      lVar9 = (long)(iVar3 * 5) * 2 + 0x3010ca;
      lVar5 = 0;
      iVar7 = length + 1;
      do {
        if (*(ushort *)(lVar9 + lVar5) == 0) {
          iVar8 = 1;
          goto LAB_0029860c;
        }
        iVar8 = (uint)*(ushort *)((long)s + lVar5) - (uint)*(ushort *)(lVar9 + lVar5);
        if (iVar8 != 0) goto LAB_00298601;
        lVar5 = lVar5 + 2;
        iVar7 = iVar7 + -1;
      } while (1 < iVar7);
      if (length == 3) {
LAB_00298632:
        iVar3 = 3;
        while( true ) {
          if (4 < iVar3) {
            return '\x01';
          }
          uVar1 = *(ushort *)(lVar9 + (long)iVar3 * 2);
          c = (uint)uVar1;
          if (uVar1 == 0) break;
          iVar4 = iVar3 + 1;
          if ((c & 0xfc00) == 0xd800) {
            iVar4 = iVar3 + 2;
            c = (uint)uVar1 * 0x400 + (uint)*(ushort *)(lVar9 + (long)(iVar3 + 1) * 2) + 0xfca02400;
          }
          (*(code *)sa->add)(sa->set,c);
          ucase_addCaseClosure_63(c,sa);
          iVar3 = iVar4;
        }
        return '\x01';
      }
      iVar8 = -(uint)(*(short *)(lVar9 + lVar5) != 0);
LAB_00298601:
      if (iVar8 == 0) goto LAB_00298632;
LAB_0029860c:
      if (iVar8 < 0) {
        uVar6 = uVar2;
      }
      uVar6 = uVar6 & 0xffffffff;
      iVar3 = iVar3 + 1;
      if (iVar8 < 0) {
        iVar3 = iVar4;
      }
    }
  }
  return '\0';
}

Assistant:

U_CFUNC UBool U_EXPORT2
ucase_addStringCaseClosure(const UChar *s, int32_t length, const USetAdder *sa) {
    int32_t i, start, limit, result, unfoldRows, unfoldRowWidth, unfoldStringWidth;

    if(ucase_props_singleton.unfold==NULL || s==NULL) {
        return FALSE; /* no reverse case folding data, or no string */
    }
    if(length<=1) {
        /* the string is too short to find any match */
        /*
         * more precise would be:
         * if(!u_strHasMoreChar32Than(s, length, 1))
         * but this does not make much practical difference because
         * a single supplementary code point would just not be found
         */
        return FALSE;
    }

    const uint16_t *unfold=ucase_props_singleton.unfold;
    unfoldRows=unfold[UCASE_UNFOLD_ROWS];
    unfoldRowWidth=unfold[UCASE_UNFOLD_ROW_WIDTH];
    unfoldStringWidth=unfold[UCASE_UNFOLD_STRING_WIDTH];
    unfold+=unfoldRowWidth;

    if(length>unfoldStringWidth) {
        /* the string is too long to find any match */
        return FALSE;
    }

    /* do a binary search for the string */
    start=0;
    limit=unfoldRows;
    while(start<limit) {
        i=(start+limit)/2;
        const UChar *p=reinterpret_cast<const UChar *>(unfold+(i*unfoldRowWidth));
        result=strcmpMax(s, length, p, unfoldStringWidth);

        if(result==0) {
            /* found the string: add each code point, and its case closure */
            UChar32 c;

            for(i=unfoldStringWidth; i<unfoldRowWidth && p[i]!=0;) {
                U16_NEXT_UNSAFE(p, i, c);
                sa->add(sa->set, c);
                ucase_addCaseClosure(c, sa);
            }
            return TRUE;
        } else if(result<0) {
            limit=i;
        } else /* result>0 */ {
            start=i+1;
        }
    }

    return FALSE; /* string not found */
}